

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool ra_overwrite(roaring_array_t *source,roaring_array_t *dest,_Bool copy_on_write)

{
  int32_t new_capacity;
  uint8_t *puVar1;
  long *plVar2;
  void *pvVar3;
  bool bVar4;
  _Bool _Var5;
  int iVar6;
  long *plVar7;
  container_t *pcVar8;
  long lVar9;
  long lVar10;
  
  ra_clear_containers(dest);
  new_capacity = source->size;
  if (new_capacity == 0) {
    dest->size = 0;
  }
  else {
    if ((dest->allocation_size < new_capacity) && (_Var5 = realloc_array(dest,new_capacity), !_Var5)
       ) {
      return false;
    }
    iVar6 = source->size;
    dest->size = iVar6;
    memcpy(dest->keys,source->keys,(long)iVar6 * 2);
    if (copy_on_write) {
      iVar6 = dest->size;
      if (0 < iVar6) {
        lVar10 = 0;
        do {
          puVar1 = source->typecodes;
          plVar2 = (long *)source->containers[lVar10];
          if (puVar1[lVar10] == '\x04') {
            LOCK();
            *(int *)((long)plVar2 + 0xc) = *(int *)((long)plVar2 + 0xc) + 1;
            UNLOCK();
            plVar7 = plVar2;
          }
          else {
            plVar7 = (long *)(*global_memory_hook.malloc)(0x10);
            if (plVar7 == (long *)0x0) {
              plVar7 = (long *)0x0;
            }
            else {
              *plVar7 = (long)plVar2;
              *(uint8_t *)(plVar7 + 1) = puVar1[lVar10];
              LOCK();
              *(undefined4 *)((long)plVar7 + 0xc) = 2;
              UNLOCK();
              puVar1[lVar10] = '\x04';
            }
          }
          source->containers[lVar10] = plVar7;
          lVar10 = lVar10 + 1;
          iVar6 = dest->size;
        } while (lVar10 < iVar6);
      }
      memcpy(dest->containers,source->containers,(long)iVar6 << 3);
      memcpy(dest->typecodes,source->typecodes,(long)dest->size);
    }
    else {
      memcpy(dest->typecodes,source->typecodes,(long)dest->size);
      bVar4 = 0 < dest->size;
      if (0 < dest->size) {
        pcVar8 = container_clone(*source->containers,*source->typecodes);
        *dest->containers = pcVar8;
        pvVar3 = *dest->containers;
        if (pvVar3 == (void *)0x0) {
          lVar10 = 0;
        }
        else {
          lVar9 = 1;
          do {
            lVar10 = lVar9;
            bVar4 = lVar10 < dest->size;
            if (dest->size <= lVar10) {
              return true;
            }
            pcVar8 = container_clone(source->containers[lVar10],source->typecodes[lVar10]);
            dest->containers[lVar10] = pcVar8;
            lVar9 = lVar10 + 1;
          } while (dest->containers[lVar10] != (void *)0x0);
        }
        if (pvVar3 != (void *)0x0) {
          lVar9 = 0;
          do {
            container_free(dest->containers[lVar9],dest->typecodes[lVar9]);
            lVar9 = lVar9 + 1;
          } while (lVar10 != lVar9);
        }
        (*global_memory_hook.free)(dest->containers);
        dest->keys = (uint16_t *)0x0;
        dest->typecodes = (uint8_t *)0x0;
        dest->size = 0;
        dest->allocation_size = 0;
        dest->containers = (void **)0x0;
        if (bVar4) {
          return false;
        }
      }
    }
  }
  return true;
}

Assistant:

bool ra_overwrite(const roaring_array_t *source, roaring_array_t *dest,
                  bool copy_on_write) {
    ra_clear_containers(dest);  // we are going to overwrite them
    if (source->size == 0) {    // Note: can't call memcpy(NULL), even w/size
        dest->size = 0;         // <--- This is important.
        return true;            // output was just cleared, so they match
    }
    if (dest->allocation_size < source->size) {
        if (!realloc_array(dest, source->size)) {
            return false;
        }
    }
    dest->size = source->size;
    memcpy(dest->keys, source->keys, dest->size * sizeof(uint16_t));
    // we go through the containers, turning them into shared containers...
    if (copy_on_write) {
        for (int32_t i = 0; i < dest->size; ++i) {
            source->containers[i] = get_copy_of_container(
                source->containers[i], &source->typecodes[i], copy_on_write);
        }
        // we do a shallow copy to the other bitmap
        memcpy(dest->containers, source->containers,
               dest->size * sizeof(container_t *));
        memcpy(dest->typecodes, source->typecodes,
               dest->size * sizeof(uint8_t));
    } else {
        memcpy(dest->typecodes, source->typecodes,
               dest->size * sizeof(uint8_t));
        for (int32_t i = 0; i < dest->size; i++) {
            dest->containers[i] =
                container_clone(source->containers[i], source->typecodes[i]);
            if (dest->containers[i] == NULL) {
                for (int32_t j = 0; j < i; j++) {
                    container_free(dest->containers[j], dest->typecodes[j]);
                }
                ra_clear_without_containers(dest);
                return false;
            }
        }
    }
    return true;
}